

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::_::(anonymous_namespace)::SiPair_&> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
::find<1ul,int>(Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>
                *this,char (*params) [7])

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  uint *in_RDX;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  lVar2 = *(long *)params;
  uVar3 = *(ulong *)(params[0xd] + 5);
  if (uVar3 == 0) {
    bVar4 = false;
  }
  else {
    uVar1 = *in_RDX;
    uVar7 = uVar1 * 0x8000 + ~uVar1;
    uVar7 = (uVar7 >> 0xc ^ uVar7) * 5;
    uVar8 = (uVar7 >> 4 ^ uVar7) * 0x809;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
    uVar9 = (ulong)((int)uVar3 - 1U & uVar8);
    lVar5 = *(long *)(params[0xc] + 4);
    uVar7 = *(uint *)(lVar5 + 4 + uVar9 * 8);
    params = (char (*) [7])(ulong)uVar7;
    if (uVar7 != 0) {
      puVar6 = (uint *)(lVar5 + uVar9 * 8);
      do {
        if ((((int)params != 1) && (*puVar6 == uVar8)) &&
           (params = (char (*) [7])(ulong)((int)params - 2),
           *(uint *)(lVar2 + 0x10 + (long)params * 0x18) == uVar1)) {
          bVar4 = true;
          goto LAB_001616ec;
        }
        uVar10 = uVar9 + 1;
        uVar9 = 0;
        if (uVar10 != uVar3) {
          uVar9 = uVar10 & 0xffffffff;
        }
        puVar6 = (uint *)(lVar5 + uVar9 * 8);
        params = (char (*) [7])(ulong)puVar6[1];
      } while (puVar6[1] != 0);
    }
    bVar4 = false;
  }
LAB_001616ec:
  lVar5 = 0;
  if (bVar4) {
    lVar5 = lVar2 + (long)params * 0x18;
  }
  *(long *)this = lVar5;
  return (Maybe<kj::_::(anonymous_namespace)::SiPair_&>)(SiPair *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}